

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<Fad<double>,_3>::Resize
          (TPZManVector<Fad<double>,_3> *this,int64_t newsize,Fad<double> *object)

{
  undefined8 *puVar1;
  double *pdVar2;
  ulong *puVar3;
  long lVar4;
  Fad<double> *pFVar5;
  Vector<double> *pVVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar7 = (this->super_TPZVec<Fad<double>_>).fNElements;
  if (newsize != lVar7) {
    lVar4 = (this->super_TPZVec<Fad<double>_>).fNAlloc;
    if (lVar4 < newsize) {
      if ((ulong)newsize < 4) {
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          lVar4 = 0;
          lVar7 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar4);
            *(undefined8 *)((long)&this->fExtAlloc[0].val_ + lVar4) = *puVar1;
            Vector<double>::operator=
                      ((Vector<double> *)((long)&this->fExtAlloc[0].dx_.num_elts + lVar4),
                       (Vector<double> *)(puVar1 + 1));
            *(undefined8 *)((long)&this->fExtAlloc[0].defaultVal + lVar4) = puVar1[3];
            lVar7 = lVar7 + 1;
            lVar4 = lVar4 + 0x20;
          } while (lVar7 < (this->super_TPZVec<Fad<double>_>).fNElements);
        }
        lVar4 = newsize - lVar7;
        if (lVar4 != 0 && lVar7 <= newsize) {
          pFVar5 = this->fExtAlloc + lVar7 + -1;
          do {
            pFVar5[1].val_ = object->val_;
            Vector<double>::operator=(&pFVar5[1].dx_,&object->dx_);
            pFVar5[1].defaultVal = object->defaultVal;
            lVar4 = lVar4 + -1;
            pFVar5 = pFVar5 + 1;
          } while (lVar4 != 0);
        }
        pFVar5 = (this->super_TPZVec<Fad<double>_>).fStore;
        if (pFVar5 != (Fad<double> *)0x0 && pFVar5 != this->fExtAlloc) {
          dVar9 = pFVar5[-1].defaultVal;
          if (dVar9 != 0.0) {
            lVar7 = (long)dVar9 << 5;
            do {
              Fad<double>::~Fad((Fad<double> *)((long)&pFVar5[-1].val_ + lVar7));
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != 0);
          }
          operator_delete__(&pFVar5[-1].defaultVal,(long)dVar9 << 5 | 8);
        }
        (this->super_TPZVec<Fad<double>_>).fStore = this->fExtAlloc;
        (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
        (this->super_TPZVec<Fad<double>_>).fNAlloc = 3;
      }
      else {
        dVar9 = (double)lVar4 * 1.2;
        uVar8 = (long)dVar9;
        if (dVar9 < (double)newsize) {
          uVar8 = newsize;
        }
        puVar3 = (ulong *)operator_new__(-(ulong)(uVar8 >> 0x3b != 0) | uVar8 * 0x20 | 8);
        *puVar3 = uVar8;
        if (uVar8 != 0) {
          lVar7 = 0;
          pFVar5 = (Fad<double> *)(puVar3 + 1);
          do {
            Fad<double>::Fad(pFVar5);
            lVar7 = lVar7 + -0x20;
            pFVar5 = pFVar5 + 1;
          } while (-lVar7 != uVar8 * 0x20);
          lVar7 = (this->super_TPZVec<Fad<double>_>).fNElements;
        }
        if (lVar7 < 1) {
          lVar7 = 0;
        }
        else {
          pVVar6 = (Vector<double> *)(puVar3 + 2);
          lVar4 = 0;
          lVar7 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar4);
            pVVar6[-1].ptr_to_data = (double *)*puVar1;
            Vector<double>::operator=(pVVar6,(Vector<double> *)(puVar1 + 1));
            *(undefined8 *)(pVVar6 + 1) = puVar1[3];
            lVar7 = lVar7 + 1;
            pVVar6 = pVVar6 + 2;
            lVar4 = lVar4 + 0x20;
          } while (lVar7 < (this->super_TPZVec<Fad<double>_>).fNElements);
        }
        lVar4 = newsize - lVar7;
        if (lVar4 != 0 && lVar7 <= newsize) {
          pVVar6 = (Vector<double> *)(puVar3 + lVar7 * 4 + 2);
          do {
            pVVar6[-1].ptr_to_data = (double *)object->val_;
            Vector<double>::operator=(pVVar6,&object->dx_);
            *(double *)(pVVar6 + 1) = object->defaultVal;
            pVVar6 = pVVar6 + 2;
            lVar4 = lVar4 + -1;
          } while (lVar4 != 0);
        }
        pFVar5 = (this->super_TPZVec<Fad<double>_>).fStore;
        if (pFVar5 != (Fad<double> *)0x0 && pFVar5 != this->fExtAlloc) {
          dVar9 = pFVar5[-1].defaultVal;
          if (dVar9 != 0.0) {
            lVar7 = (long)dVar9 << 5;
            do {
              Fad<double>::~Fad((Fad<double> *)((long)&pFVar5[-1].val_ + lVar7));
              lVar7 = lVar7 + -0x20;
            } while (lVar7 != 0);
          }
          operator_delete__(&pFVar5[-1].defaultVal,(long)dVar9 << 5 | 8);
        }
        (this->super_TPZVec<Fad<double>_>).fStore = (Fad<double> *)(puVar3 + 1);
        (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
        (this->super_TPZVec<Fad<double>_>).fNAlloc = uVar8;
      }
    }
    else {
      lVar4 = newsize - lVar7;
      if (lVar4 != 0 && lVar7 <= newsize) {
        lVar7 = lVar7 << 5;
        do {
          pdVar2 = (double *)((long)&((this->super_TPZVec<Fad<double>_>).fStore)->val_ + lVar7);
          *pdVar2 = object->val_;
          Vector<double>::operator=((Vector<double> *)(pdVar2 + 1),&object->dx_);
          pdVar2[3] = object->defaultVal;
          lVar7 = lVar7 + 0x20;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      (this->super_TPZVec<Fad<double>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}